

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

_Bool handled_read_error(cio_websocket *websocket,cio_error err)

{
  cio_error err_local;
  cio_websocket *websocket_local;
  
  if (err == CIO_SUCCESS) {
    websocket_local._7_1_ = false;
  }
  else {
    if (err == CIO_EOF) {
      handle_error(websocket,CIO_EOF,CIO_WEBSOCKET_CLOSE_NORMAL,"connection closed by other peer");
    }
    else {
      handle_error(websocket,err,CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR,
                   "error while reading websocket packet");
    }
    websocket_local._7_1_ = true;
  }
  return websocket_local._7_1_;
}

Assistant:

static inline bool handled_read_error(struct cio_websocket *websocket, enum cio_error err)
{
	if (cio_unlikely(err != CIO_SUCCESS)) {
		if (err == CIO_EOF) {
			handle_error(websocket, CIO_EOF, CIO_WEBSOCKET_CLOSE_NORMAL, "connection closed by other peer");
		} else {
			handle_error(websocket, err, CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, "error while reading websocket packet");
		}

		return true;
	}

	return false;
}